

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

CTransactionRef __thiscall
node::GetTransaction
          (node *this,CBlockIndex *block_index,CTxMemPool *mempool,uint256 *hash,uint256 *hashBlock,
          BlockManager *blockman)

{
  uint256 *puVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  unique_ptr<TxIndex,_std::default_delete<TxIndex>_> this_00;
  bool bVar7;
  pointer psVar8;
  CTxMemPool *extraout_RDX;
  CTxMemPool *extraout_RDX_00;
  CTxMemPool *extraout_RDX_01;
  CTxMemPool *extraout_RDX_02;
  CTxMemPool *extraout_RDX_03;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  CTransactionRef CVar13;
  uint256 block_hash;
  undefined1 local_c8 [17];
  uchar uStack_b7;
  uchar uStack_b6;
  uchar uStack_b5;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  uchar uStack_b1;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  uchar uStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  uchar uStack_a9;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  pointer local_68;
  undefined3 uStack_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (block_index == (CBlockIndex *)0x0 && mempool != (CTxMemPool *)0x0) {
    CVar13 = CTxMemPool::get((CTxMemPool *)this,(uint256 *)mempool);
    mempool = (CTxMemPool *)
              CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (*(long *)this != 0) goto LAB_0027a7dc;
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8));
      mempool = extraout_RDX_00;
    }
  }
  this_00._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
  super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
  super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl =
       g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
       super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
       super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
      g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
      super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
      super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
    *(undefined1 (*) [16])this = (undefined1  [16])0x0;
    stack0xffffffffffffff48 = (undefined1  [16])0x0;
    local_c8._0_16_ = (undefined1  [16])0x0;
    bVar7 = TxIndex::FindTx((TxIndex *)
                            this_00._M_t.
                            super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
                            super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
                            super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl,hash,
                            (uint256 *)local_c8,(CTransactionRef *)this);
    if (bVar7) {
      if (block_index != (CBlockIndex *)0x0) {
        puVar1 = block_index->phashBlock;
        if (puVar1 == (uint256 *)0x0) {
LAB_0027a854:
          __assert_fail("phashBlock != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                        ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
        }
        auVar10[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x10] == local_c8[0x10]);
        auVar10[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x11] == uStack_b7);
        auVar10[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x12] == uStack_b6);
        auVar10[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x13] == uStack_b5);
        auVar10[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x14] == uStack_b4);
        auVar10[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x15] == uStack_b3);
        auVar10[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x16] == uStack_b2);
        auVar10[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x17] == uStack_b1);
        auVar10[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x18] == uStack_b0);
        auVar10[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x19] == uStack_af);
        auVar10[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1a] == uStack_ae);
        auVar10[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1b] == uStack_ad);
        auVar10[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1c] == uStack_ac);
        auVar10[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1d] == uStack_ab);
        auVar10[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1e] == uStack_aa);
        auVar10[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1f] == uStack_a9);
        auVar9[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == local_c8[0]);
        auVar9[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] == local_c8[1]);
        auVar9[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] == local_c8[2]);
        auVar9[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] == local_c8[3]);
        auVar9[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] == local_c8[4]);
        auVar9[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] == local_c8[5]);
        auVar9[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] == local_c8[6]);
        auVar9[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] == local_c8[7]);
        auVar9[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] == local_c8[8]);
        auVar9[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] == local_c8[9]);
        auVar9[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] == local_c8[10]);
        auVar9[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] == local_c8[0xb]);
        auVar9[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] == local_c8[0xc]);
        auVar9[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] == local_c8[0xd]);
        auVar9[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] == local_c8[0xe]);
        auVar9[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] == local_c8[0xf]);
        auVar9 = auVar9 & auVar10;
        if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0027a671;
      }
      *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x10) =
           stack0xffffffffffffff48;
      *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x18) = _uStack_b0;
      *(undefined8 *)(hashBlock->super_base_blob<256U>).m_data._M_elems = local_c8._0_8_;
      *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 8) = local_c8._8_8_;
      bVar7 = true;
    }
    else {
LAB_0027a671:
      bVar7 = false;
    }
    mempool = extraout_RDX;
    if (bVar7) goto LAB_0027a7dc;
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8));
      mempool = extraout_RDX_01;
    }
  }
  if (block_index != (CBlockIndex *)0x0) {
    local_68 = (pointer)0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    stack0xffffffffffffff48 = (undefined1  [16])0x0;
    local_c8._0_16_ = (undefined1  [16])0x0;
    uStack_60._0_1_ = false;
    uStack_60._1_1_ = false;
    uStack_60._2_1_ = false;
    bVar7 = BlockManager::ReadBlockFromDisk(blockman,(CBlock *)local_c8,block_index);
    if (bVar7) {
      if (local_78._0_8_ != local_78._8_8_) {
        psVar8 = (pointer)local_78._0_8_;
        do {
          peVar2 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          auVar11[0] = -((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0]);
          auVar11[1] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 1) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[1]);
          auVar11[2] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 2) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[2]);
          auVar11[3] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 3) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[3]);
          auVar11[4] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 4) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[4]);
          auVar11[5] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 5) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[5]);
          auVar11[6] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 6) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[6]);
          auVar11[7] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 7) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[7]);
          auVar11[8] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 8) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[8]);
          auVar11[9] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 9) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[9]);
          auVar11[10] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                           _M_elems + 10) ==
                         (hash->super_base_blob<256U>).m_data._M_elems[10]);
          auVar11[0xb] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0xb) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar11[0xc] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0xc) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar11[0xd] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0xd) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar11[0xe] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0xe) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar11[0xf] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0xf) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar12[0] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x10) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x10]);
          auVar12[1] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x11) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x11]);
          auVar12[2] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x12) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x12]);
          auVar12[3] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x13) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x13]);
          auVar12[4] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x14) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x14]);
          auVar12[5] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x15) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x15]);
          auVar12[6] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x16) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x16]);
          auVar12[7] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x17) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x17]);
          auVar12[8] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x18) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x18]);
          auVar12[9] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x19) ==
                        (hash->super_base_blob<256U>).m_data._M_elems[0x19]);
          auVar12[10] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                           _M_elems + 0x1a) ==
                         (hash->super_base_blob<256U>).m_data._M_elems[0x1a]);
          auVar12[0xb] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0x1b) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0x1b]);
          auVar12[0xc] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0x1c) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0x1c]);
          auVar12[0xd] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0x1d) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0x1d]);
          auVar12[0xe] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0x1e) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0x1e]);
          auVar12[0xf] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                            _M_elems + 0x1f) ==
                          (hash->super_base_blob<256U>).m_data._M_elems[0x1f]);
          auVar12 = auVar12 & auVar11;
          if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
            puVar1 = block_index->phashBlock;
            if (puVar1 == (uint256 *)0x0) goto LAB_0027a854;
            uVar4 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
            uVar5 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
            uVar6 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
            *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x10) =
                 *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
            *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar6;
            *(undefined8 *)(hashBlock->super_base_blob<256U>).m_data._M_elems = uVar4;
            *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 8) = uVar5;
            *(element_type **)this =
                 (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            p_Var3 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
            }
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)local_78);
            mempool = extraout_RDX_03;
            goto LAB_0027a7dc;
          }
          psVar8 = psVar8 + 1;
        } while (psVar8 != (pointer)local_78._8_8_);
      }
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_78);
    mempool = extraout_RDX_02;
  }
  *(undefined1 (*) [16])this = (undefined1  [16])0x0;
LAB_0027a7dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mempool;
    CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)
           CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

CTransactionRef GetTransaction(const CBlockIndex* const block_index, const CTxMemPool* const mempool, const uint256& hash, uint256& hashBlock, const BlockManager& blockman)
{
    if (mempool && !block_index) {
        CTransactionRef ptx = mempool->get(hash);
        if (ptx) return ptx;
    }
    if (g_txindex) {
        CTransactionRef tx;
        uint256 block_hash;
        if (g_txindex->FindTx(hash, block_hash, tx)) {
            if (!block_index || block_index->GetBlockHash() == block_hash) {
                // Don't return the transaction if the provided block hash doesn't match.
                // The case where a transaction appears in multiple blocks (e.g. reorgs or
                // BIP30) is handled by the block lookup below.
                hashBlock = block_hash;
                return tx;
            }
        }
    }
    if (block_index) {
        CBlock block;
        if (blockman.ReadBlockFromDisk(block, *block_index)) {
            for (const auto& tx : block.vtx) {
                if (tx->GetHash() == hash) {
                    hashBlock = block_index->GetBlockHash();
                    return tx;
                }
            }
        }
    }
    return nullptr;
}